

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugNames::Abbrev::dump(Abbrev *this,ScopedPrinter *W)

{
  bool bVar1;
  raw_ostream *prVar2;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
  local_180;
  reference local_120;
  AttributeEncoding *Attr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  *__range1;
  ulong local_a0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  string local_50;
  StringRef local_30;
  DelimitedScope<___,____> local_20;
  DictScope AbbrevScope;
  ScopedPrinter *W_local;
  Abbrev *this_local;
  
  AbbrevScope.W = W;
  Twine::Twine(&local_80,"Abbreviation 0x");
  local_a0 = (ulong)this->Code;
  Twine::utohexstr(&local_98,&local_a0);
  llvm::operator+(&local_68,&local_80,&local_98);
  Twine::str_abi_cxx11_(&local_50,&local_68);
  StringRef::StringRef(&local_30,&local_50);
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_20,W,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  prVar2 = ScopedPrinter::startLine(AbbrevScope.W);
  formatv<const_llvm::dwarf::Tag_&>
            ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
              *)&__range1,"Tag: {0}\n",&this->Tag);
  raw_ostream::operator<<(prVar2,(formatv_object_base *)&__range1);
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>::
  ~formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
                   *)&__range1);
  __end1 = std::
           vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
           ::begin(&this->Attributes);
  Attr = (AttributeEncoding *)
         std::
         vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
         ::end(&this->Attributes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
                                *)&Attr);
    if (!bVar1) break;
    local_120 = __gnu_cxx::
                __normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
                ::operator*(&__end1);
    prVar2 = ScopedPrinter::startLine(AbbrevScope.W);
    formatv<const_llvm::dwarf::Index_&,_const_llvm::dwarf::Form_&>
              (&local_180,"{0}: {1}\n",&local_120->Index,&local_120->Form);
    raw_ostream::operator<<(prVar2,&local_180.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
    ::~formatv_object(&local_180);
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
    ::operator++(&__end1);
  }
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_20);
  return;
}

Assistant:

void DWARFDebugNames::Abbrev::dump(ScopedPrinter &W) const {
  DictScope AbbrevScope(W, ("Abbreviation 0x" + Twine::utohexstr(Code)).str());
  W.startLine() << formatv("Tag: {0}\n", Tag);

  for (const auto &Attr : Attributes)
    W.startLine() << formatv("{0}: {1}\n", Attr.Index, Attr.Form);
}